

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructPrim<tinyusdz::PointInstancer>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               PointInstancer *instancer,string *warn,string *err,PrimReconstructOptions *options)

{
  bool bVar1;
  uint uVar2;
  Relationship *value;
  Property *pPVar3;
  size_type sVar4;
  mapped_type *this;
  ostream *poVar5;
  Property *pPVar6;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  undefined4 in_stack_ffffffffffffe4ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ab0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a70;
  ostringstream local_1a50 [8];
  ostringstream ss_e_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18a8 [39];
  allocator local_1881;
  string local_1880 [32];
  string local_1860;
  ostringstream local_1840 [8];
  ostringstream ss_e_9;
  allocator local_16c1;
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [40];
  ParseResult ret_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1638 [39];
  allocator local_1611;
  string local_1610 [32];
  string local_15f0;
  ostringstream local_15d0 [8];
  ostringstream ss_e_8;
  allocator local_1451;
  undefined1 local_1450 [32];
  undefined1 local_1430 [40];
  ParseResult ret_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13c8 [39];
  allocator local_13a1;
  string local_13a0 [32];
  string local_1380;
  ostringstream local_1360 [8];
  ostringstream ss_e_7;
  allocator local_11e1;
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [8];
  ParseResult ret_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1158 [39];
  allocator local_1131;
  string local_1130 [32];
  string local_1110;
  ostringstream local_10f0 [8];
  ostringstream ss_e_6;
  allocator local_f71;
  undefined1 local_f70 [32];
  undefined1 local_f50 [32];
  undefined1 local_f30 [8];
  ParseResult ret_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ee8 [39];
  allocator local_ec1;
  string local_ec0 [32];
  string local_ea0;
  ostringstream local_e80 [8];
  ostringstream ss_e_5;
  allocator local_d01;
  undefined1 local_d00 [32];
  undefined1 local_ce0 [32];
  undefined1 local_cc0 [8];
  ParseResult ret_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c78 [39];
  allocator local_c51;
  string local_c50 [32];
  string local_c30;
  ostringstream local_c10 [8];
  ostringstream ss_e_4;
  allocator local_a91;
  undefined1 local_a90 [32];
  undefined1 local_a70 [32];
  undefined1 local_a50 [8];
  ParseResult ret_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a08 [39];
  allocator local_9e1;
  string local_9e0 [32];
  string local_9c0;
  ostringstream local_9a0 [8];
  ostringstream ss_e_3;
  allocator local_821;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  ParseResult ret_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798 [39];
  allocator local_771;
  string local_770 [32];
  string local_750;
  ostringstream local_730 [8];
  ostringstream ss_e_2;
  allocator local_5b1;
  undefined1 local_5b0 [32];
  undefined1 local_590 [32];
  undefined1 local_570 [8];
  ParseResult ret_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528 [39];
  allocator local_501;
  string local_500 [32];
  string local_4e0;
  ostringstream local_4c0 [8];
  ostringstream ss_e_1;
  allocator local_341;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  ParseResult ret;
  Relationship *rel;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0 [39];
  allocator local_279;
  string local_278;
  string local_258;
  ostringstream local_238 [8];
  ostringstream ss_e;
  allocator local_b9;
  key_type local_b8 [4];
  reference_conflict local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  undefined1 local_70 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string *err_local;
  string *warn_local;
  PointInstancer *instancer_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_70);
  bVar1 = (bool)(options->strict_allowedToken_check & 1);
  uVar2 = (uint)bVar1;
  bVar1 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_70,properties,&instancer->super_GPrim,warn,
                     (string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,bVar1);
  if (bVar1) {
    __end2 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::begin(properties);
    prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
            *)::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::end(properties);
    while (bVar1 = ::std::operator!=(&__end2,(_Self *)&prop), bVar1) {
      local_98 = ::std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
                 ::operator*(&__end2);
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_98,"prototypes");
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_b8,"prototypes",&local_b9);
        sVar4 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_70,local_b8);
        ::std::__cxx11::string::~string((string *)local_b8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        if (sVar4 == 0) {
          bVar1 = Property::is_relationship(&local_98->second);
          if (!bVar1) {
            ::std::__cxx11::ostringstream::ostringstream(local_238);
            poVar5 = ::std::operator<<((ostream *)local_238,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xf54);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_278,"`{}` must be a Relationship",&local_279);
            fmt::format<char[11]>(&local_258,&local_278,(char (*) [11])"prototypes");
            poVar5 = ::std::operator<<((ostream *)local_238,(string *)&local_258);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_258);
            ::std::__cxx11::string::~string((string *)&local_278);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_279);
            if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_2a0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &rel);
              ::std::__cxx11::string::operator=
                        ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (string *)local_2a0);
              ::std::__cxx11::string::~string((string *)local_2a0);
              ::std::__cxx11::string::~string((string *)&rel);
            }
            spec_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_238);
            goto LAB_002c3d36;
          }
          value = Property::get_relationship(&local_98->second);
          nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                    (&instancer->prototypes,value);
          pVar7 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_70,&local_98->first);
          ret.err.field_2._8_8_ = pVar7.first._M_node;
        }
      }
      else {
        ::std::__cxx11::string::string((string *)local_320,(string *)local_98);
        pPVar3 = &local_98->second;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_340,"protoIndices",&local_341);
        pPVar6 = (Property *)local_340;
        (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                  ((ParseResult *)local_300,(_anonymous_namespace_ *)local_70,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_320,(string *)pPVar3,pPVar6,(string *)&instancer->protoIndices,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *
                   )CONCAT44(in_stack_ffffffffffffe4ac,uVar2));
        ::std::__cxx11::string::~string((string *)local_340);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_341);
        ::std::__cxx11::string::~string((string *)local_320);
        if ((local_300._0_4_ == Success) || (local_300._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_300._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_4c0);
          poVar5 = ::std::operator<<((ostream *)local_4c0,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xf55);
          ::std::operator<<(poVar5," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_500,"Parsing attribute `{}` failed. Error: {}",&local_501);
          fmt::format<char[13],std::__cxx11::string>
                    (&local_4e0,(fmt *)local_500,(string *)"protoIndices",(char (*) [13])&ret,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar6);
          poVar5 = ::std::operator<<((ostream *)local_4c0,(string *)&local_4e0);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::string::~string((string *)&local_4e0);
          ::std::__cxx11::string::~string(local_500);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_501);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_528,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_1.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_528);
            ::std::__cxx11::string::~string((string *)local_528);
            ::std::__cxx11::string::~string((string *)(ret_1.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_4c0);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_300);
        if (__range2._4_4_ == 0) {
          ::std::__cxx11::string::string((string *)local_590,(string *)local_98);
          pPVar3 = &local_98->second;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)local_5b0,"ids",&local_5b1);
          pPVar6 = (Property *)local_5b0;
          (anonymous_namespace)::ParseTypedAttribute<std::vector<long,std::allocator<long>>>
                    ((ParseResult *)local_570,(_anonymous_namespace_ *)local_70,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_590,(string *)pPVar3,pPVar6,(string *)&instancer->ids,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_>
                      *)CONCAT44(in_stack_ffffffffffffe4ac,uVar2));
          ::std::__cxx11::string::~string((string *)local_5b0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
          ::std::__cxx11::string::~string((string *)local_590);
          if ((local_570._0_4_ == Success) || (local_570._0_4_ == AlreadyProcessed)) {
            __range2._4_4_ = 3;
          }
          else if (local_570._0_4_ == Unmatched) {
            __range2._4_4_ = 0;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_730);
            poVar5 = ::std::operator<<((ostream *)local_730,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xf56);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_770,"Parsing attribute `{}` failed. Error: {}",&local_771);
            fmt::format<char[4],std::__cxx11::string>
                      (&local_750,(fmt *)local_770,(string *)"ids",(char (*) [4])&ret_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar6);
            poVar5 = ::std::operator<<((ostream *)local_730,(string *)&local_750);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_750);
            ::std::__cxx11::string::~string(local_770);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_771);
            if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_798,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (ret_2.err.field_2._M_local_buf + 8));
              ::std::__cxx11::string::operator=
                        ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (string *)local_798);
              ::std::__cxx11::string::~string((string *)local_798);
              ::std::__cxx11::string::~string((string *)(ret_2.err.field_2._M_local_buf + 8));
            }
            spec_local._7_1_ = 0;
            __range2._4_4_ = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_730);
          }
          anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_570);
          if (__range2._4_4_ == 0) {
            ::std::__cxx11::string::string((string *)local_800,(string *)local_98);
            pPVar3 = &local_98->second;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)local_820,"positions",&local_821);
            pPVar6 = (Property *)local_820;
            (anonymous_namespace)::
            ParseTypedAttribute<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                      ((ParseResult *)local_7e0,(_anonymous_namespace_ *)local_70,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_800,(string *)pPVar3,pPVar6,(string *)&instancer->positions,
                       (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffe4ac,uVar2));
            ::std::__cxx11::string::~string((string *)local_820);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_821);
            ::std::__cxx11::string::~string((string *)local_800);
            if ((local_7e0._0_4_ == Success) || (local_7e0._0_4_ == AlreadyProcessed)) {
              __range2._4_4_ = 3;
            }
            else if (local_7e0._0_4_ == Unmatched) {
              __range2._4_4_ = 0;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_9a0);
              poVar5 = ::std::operator<<((ostream *)local_9a0,"[error]");
              poVar5 = ::std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar5 = ::std::operator<<(poVar5,":");
              poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
              poVar5 = ::std::operator<<(poVar5,"():");
              poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xf57);
              ::std::operator<<(poVar5," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_9e0,"Parsing attribute `{}` failed. Error: {}",&local_9e1);
              fmt::format<char[10],std::__cxx11::string>
                        (&local_9c0,(fmt *)local_9e0,(string *)"positions",(char (*) [10])&ret_2,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar6
                        );
              poVar5 = ::std::operator<<((ostream *)local_9a0,(string *)&local_9c0);
              ::std::operator<<(poVar5,"\n");
              ::std::__cxx11::string::~string((string *)&local_9c0);
              ::std::__cxx11::string::~string(local_9e0);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_9e1);
              if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_a08,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(ret_3.err.field_2._M_local_buf + 8));
                ::std::__cxx11::string::operator=
                          ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (string *)local_a08);
                ::std::__cxx11::string::~string((string *)local_a08);
                ::std::__cxx11::string::~string((string *)(ret_3.err.field_2._M_local_buf + 8));
              }
              spec_local._7_1_ = 0;
              __range2._4_4_ = 1;
              ::std::__cxx11::ostringstream::~ostringstream(local_9a0);
            }
            anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_7e0);
            if (__range2._4_4_ == 0) {
              ::std::__cxx11::string::string((string *)local_a70,(string *)local_98);
              pPVar3 = &local_98->second;
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)local_a90,"orientations",&local_a91);
              pPVar6 = (Property *)local_a90;
              (anonymous_namespace)::
              ParseTypedAttribute<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                        ((ParseResult *)local_a50,(_anonymous_namespace_ *)local_70,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_a70,(string *)pPVar3,pPVar6,(string *)&instancer->orientations,
                         (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
                          *)CONCAT44(in_stack_ffffffffffffe4ac,uVar2));
              ::std::__cxx11::string::~string((string *)local_a90);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_a91);
              ::std::__cxx11::string::~string((string *)local_a70);
              if ((local_a50._0_4_ == Success) || (local_a50._0_4_ == AlreadyProcessed)) {
                __range2._4_4_ = 3;
              }
              else if (local_a50._0_4_ == Unmatched) {
                __range2._4_4_ = 0;
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_c10);
                poVar5 = ::std::operator<<((ostream *)local_c10,"[error]");
                poVar5 = ::std::operator<<(poVar5,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar5 = ::std::operator<<(poVar5,":");
                poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
                poVar5 = ::std::operator<<(poVar5,"():");
                poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xf58);
                ::std::operator<<(poVar5," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_c50,"Parsing attribute `{}` failed. Error: {}",&local_c51);
                fmt::format<char[13],std::__cxx11::string>
                          (&local_c30,(fmt *)local_c50,(string *)"orientations",
                           (char (*) [13])&ret_3,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pPVar6);
                poVar5 = ::std::operator<<((ostream *)local_c10,(string *)&local_c30);
                ::std::operator<<(poVar5,"\n");
                ::std::__cxx11::string::~string((string *)&local_c30);
                ::std::__cxx11::string::~string(local_c50);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_c51);
                if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::operator+(local_c78,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(ret_4.err.field_2._M_local_buf + 8));
                  ::std::__cxx11::string::operator=
                            ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (string *)local_c78);
                  ::std::__cxx11::string::~string((string *)local_c78);
                  ::std::__cxx11::string::~string((string *)(ret_4.err.field_2._M_local_buf + 8));
                }
                spec_local._7_1_ = 0;
                __range2._4_4_ = 1;
                ::std::__cxx11::ostringstream::~ostringstream(local_c10);
              }
              anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_a50);
              if (__range2._4_4_ == 0) {
                ::std::__cxx11::string::string((string *)local_ce0,(string *)local_98);
                pPVar3 = &local_98->second;
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string((string *)local_d00,"scales",&local_d01);
                pPVar6 = (Property *)local_d00;
                (anonymous_namespace)::
                ParseTypedAttribute<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                          ((ParseResult *)local_cc0,(_anonymous_namespace_ *)local_70,
                           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_ce0,(string *)pPVar3,pPVar6,(string *)&instancer->scales,
                           (TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                            *)CONCAT44(in_stack_ffffffffffffe4ac,uVar2));
                ::std::__cxx11::string::~string((string *)local_d00);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_d01);
                ::std::__cxx11::string::~string((string *)local_ce0);
                if ((local_cc0._0_4_ == Success) || (local_cc0._0_4_ == AlreadyProcessed)) {
                  __range2._4_4_ = 3;
                }
                else if (local_cc0._0_4_ == Unmatched) {
                  __range2._4_4_ = 0;
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_e80);
                  poVar5 = ::std::operator<<((ostream *)local_e80,"[error]");
                  poVar5 = ::std::operator<<(poVar5,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                            );
                  poVar5 = ::std::operator<<(poVar5,":");
                  poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
                  poVar5 = ::std::operator<<(poVar5,"():");
                  poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xf59);
                  ::std::operator<<(poVar5," ");
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_ec0,"Parsing attribute `{}` failed. Error: {}",&local_ec1);
                  fmt::format<char[7],std::__cxx11::string>
                            (&local_ea0,(fmt *)local_ec0,(string *)"scales",(char (*) [7])&ret_4,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pPVar6);
                  poVar5 = ::std::operator<<((ostream *)local_e80,(string *)&local_ea0);
                  ::std::operator<<(poVar5,"\n");
                  ::std::__cxx11::string::~string((string *)&local_ea0);
                  ::std::__cxx11::string::~string(local_ec0);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_ec1);
                  if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                    ::std::__cxx11::ostringstream::str();
                    ::std::operator+(local_ee8,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(ret_5.err.field_2._M_local_buf + 8));
                    ::std::__cxx11::string::operator=
                              ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               (string *)local_ee8);
                    ::std::__cxx11::string::~string((string *)local_ee8);
                    ::std::__cxx11::string::~string((string *)(ret_5.err.field_2._M_local_buf + 8));
                  }
                  spec_local._7_1_ = 0;
                  __range2._4_4_ = 1;
                  ::std::__cxx11::ostringstream::~ostringstream(local_e80);
                }
                anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_cc0);
                if (__range2._4_4_ == 0) {
                  ::std::__cxx11::string::string((string *)local_f50,(string *)local_98);
                  pPVar3 = &local_98->second;
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string((string *)local_f70,"velocities",&local_f71);
                  pPVar6 = (Property *)local_f70;
                  (anonymous_namespace)::
                  ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                            ((ParseResult *)local_f30,(_anonymous_namespace_ *)local_70,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_f50,(string *)pPVar3,pPVar6,(string *)&instancer->velocities,
                             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                              *)CONCAT44(in_stack_ffffffffffffe4ac,uVar2));
                  ::std::__cxx11::string::~string((string *)local_f70);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_f71);
                  ::std::__cxx11::string::~string((string *)local_f50);
                  if ((local_f30._0_4_ == Success) || (local_f30._0_4_ == AlreadyProcessed)) {
                    __range2._4_4_ = 3;
                  }
                  else if (local_f30._0_4_ == Unmatched) {
                    __range2._4_4_ = 0;
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream(local_10f0);
                    poVar5 = ::std::operator<<((ostream *)local_10f0,"[error]");
                    poVar5 = ::std::operator<<(poVar5,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                              );
                    poVar5 = ::std::operator<<(poVar5,":");
                    poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
                    poVar5 = ::std::operator<<(poVar5,"():");
                    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xf5a);
                    ::std::operator<<(poVar5," ");
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              (local_1130,"Parsing attribute `{}` failed. Error: {}",&local_1131);
                    fmt::format<char[11],std::__cxx11::string>
                              (&local_1110,(fmt *)local_1130,(string *)"velocities",
                               (char (*) [11])&ret_5,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pPVar6);
                    poVar5 = ::std::operator<<((ostream *)local_10f0,(string *)&local_1110);
                    ::std::operator<<(poVar5,"\n");
                    ::std::__cxx11::string::~string((string *)&local_1110);
                    ::std::__cxx11::string::~string(local_1130);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_1131);
                    if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                      ::std::__cxx11::ostringstream::str();
                      ::std::operator+(local_1158,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(ret_6.err.field_2._M_local_buf + 8));
                      ::std::__cxx11::string::operator=
                                ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 (string *)local_1158);
                      ::std::__cxx11::string::~string((string *)local_1158);
                      ::std::__cxx11::string::~string
                                ((string *)(ret_6.err.field_2._M_local_buf + 8));
                    }
                    spec_local._7_1_ = 0;
                    __range2._4_4_ = 1;
                    ::std::__cxx11::ostringstream::~ostringstream(local_10f0);
                  }
                  anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_f30);
                  if (__range2._4_4_ == 0) {
                    ::std::__cxx11::string::string((string *)local_11c0,(string *)local_98);
                    pPVar3 = &local_98->second;
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string((string *)local_11e0,"accelerations",&local_11e1)
                    ;
                    pPVar6 = (Property *)local_11e0;
                    (anonymous_namespace)::
                    ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                              ((ParseResult *)local_11a0,(_anonymous_namespace_ *)local_70,
                               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_11c0,(string *)pPVar3,pPVar6,
                               (string *)&instancer->accelerations,
                               (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                                *)CONCAT44(in_stack_ffffffffffffe4ac,uVar2));
                    ::std::__cxx11::string::~string((string *)local_11e0);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_11e1);
                    ::std::__cxx11::string::~string((string *)local_11c0);
                    if ((local_11a0._0_4_ == Success) || (local_11a0._0_4_ == AlreadyProcessed)) {
                      __range2._4_4_ = 3;
                    }
                    else if (local_11a0._0_4_ == Unmatched) {
                      __range2._4_4_ = 0;
                    }
                    else {
                      ::std::__cxx11::ostringstream::ostringstream(local_1360);
                      poVar5 = ::std::operator<<((ostream *)local_1360,"[error]");
                      poVar5 = ::std::operator<<(poVar5,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                );
                      poVar5 = ::std::operator<<(poVar5,":");
                      poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
                      poVar5 = ::std::operator<<(poVar5,"():");
                      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xf5b);
                      ::std::operator<<(poVar5," ");
                      ::std::allocator<char>::allocator();
                      ::std::__cxx11::string::string
                                (local_13a0,"Parsing attribute `{}` failed. Error: {}",&local_13a1);
                      fmt::format<char[14],std::__cxx11::string>
                                (&local_1380,(fmt *)local_13a0,(string *)"accelerations",
                                 (char (*) [14])&ret_6,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pPVar6);
                      poVar5 = ::std::operator<<((ostream *)local_1360,(string *)&local_1380);
                      ::std::operator<<(poVar5,"\n");
                      ::std::__cxx11::string::~string((string *)&local_1380);
                      ::std::__cxx11::string::~string(local_13a0);
                      ::std::allocator<char>::~allocator((allocator<char> *)&local_13a1);
                      if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                        ::std::__cxx11::ostringstream::str();
                        ::std::operator+(local_13c8,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(ret_7.err.field_2._M_local_buf + 8));
                        ::std::__cxx11::string::operator=
                                  ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                   (string *)local_13c8);
                        ::std::__cxx11::string::~string((string *)local_13c8);
                        ::std::__cxx11::string::~string
                                  ((string *)(ret_7.err.field_2._M_local_buf + 8));
                      }
                      spec_local._7_1_ = 0;
                      __range2._4_4_ = 1;
                      ::std::__cxx11::ostringstream::~ostringstream(local_1360);
                    }
                    anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_11a0);
                    if (__range2._4_4_ == 0) {
                      ::std::__cxx11::string::string((string *)local_1430,(string *)local_98);
                      pPVar3 = &local_98->second;
                      ::std::allocator<char>::allocator();
                      ::std::__cxx11::string::string
                                ((string *)local_1450,"angularVelocities",&local_1451);
                      pPVar6 = (Property *)local_1450;
                      (anonymous_namespace)::
                      ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                                ((ParseResult *)(local_1430 + 0x20),
                                 (_anonymous_namespace_ *)local_70,
                                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_1430,(string *)pPVar3,pPVar6,
                                 (string *)&instancer->angularVelocities,
                                 (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                                  *)CONCAT44(in_stack_ffffffffffffe4ac,uVar2));
                      ::std::__cxx11::string::~string((string *)local_1450);
                      ::std::allocator<char>::~allocator((allocator<char> *)&local_1451);
                      ::std::__cxx11::string::~string((string *)local_1430);
                      if ((local_1430._32_4_ == 0) || (local_1430._32_4_ == 2)) {
                        __range2._4_4_ = 3;
                      }
                      else if (local_1430._32_4_ == 1) {
                        __range2._4_4_ = 0;
                      }
                      else {
                        ::std::__cxx11::ostringstream::ostringstream(local_15d0);
                        poVar5 = ::std::operator<<((ostream *)local_15d0,"[error]");
                        poVar5 = ::std::operator<<(poVar5,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                        poVar5 = ::std::operator<<(poVar5,":");
                        poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
                        poVar5 = ::std::operator<<(poVar5,"():");
                        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xf5c);
                        ::std::operator<<(poVar5," ");
                        ::std::allocator<char>::allocator();
                        ::std::__cxx11::string::string
                                  (local_1610,"Parsing attribute `{}` failed. Error: {}",&local_1611
                                  );
                        fmt::format<char[18],std::__cxx11::string>
                                  (&local_15f0,(fmt *)local_1610,(string *)"angularVelocities",
                                   (char (*) [18])&ret_7,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pPVar6);
                        poVar5 = ::std::operator<<((ostream *)local_15d0,(string *)&local_15f0);
                        ::std::operator<<(poVar5,"\n");
                        ::std::__cxx11::string::~string((string *)&local_15f0);
                        ::std::__cxx11::string::~string(local_1610);
                        ::std::allocator<char>::~allocator((allocator<char> *)&local_1611);
                        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                          ::std::__cxx11::ostringstream::str();
                          ::std::operator+(local_1638,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(ret_8.err.field_2._M_local_buf + 8));
                          ::std::__cxx11::string::operator=
                                    ((string *)
                                     table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                     (string *)local_1638);
                          ::std::__cxx11::string::~string((string *)local_1638);
                          ::std::__cxx11::string::~string
                                    ((string *)(ret_8.err.field_2._M_local_buf + 8));
                        }
                        spec_local._7_1_ = 0;
                        __range2._4_4_ = 1;
                        ::std::__cxx11::ostringstream::~ostringstream(local_15d0);
                      }
                      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_1430 + 0x20));
                      if (__range2._4_4_ == 0) {
                        ::std::__cxx11::string::string((string *)local_16a0,(string *)local_98);
                        pPVar3 = &local_98->second;
                        ::std::allocator<char>::allocator();
                        ::std::__cxx11::string::string
                                  ((string *)local_16c0,"invisibleIds",&local_16c1);
                        pPVar6 = (Property *)local_16c0;
                        (anonymous_namespace)::
                        ParseTypedAttribute<std::vector<long,std::allocator<long>>>
                                  ((ParseResult *)(local_16a0 + 0x20),
                                   (_anonymous_namespace_ *)local_70,
                                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_16a0,(string *)pPVar3,pPVar6,
                                   (string *)&instancer->invisibleIds,
                                   (TypedAttribute<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_>
                                    *)CONCAT44(in_stack_ffffffffffffe4ac,uVar2));
                        ::std::__cxx11::string::~string((string *)local_16c0);
                        ::std::allocator<char>::~allocator((allocator<char> *)&local_16c1);
                        ::std::__cxx11::string::~string((string *)local_16a0);
                        if ((local_16a0._32_4_ == 0) || (local_16a0._32_4_ == 2)) {
                          __range2._4_4_ = 3;
                        }
                        else if (local_16a0._32_4_ == 1) {
                          __range2._4_4_ = 0;
                        }
                        else {
                          ::std::__cxx11::ostringstream::ostringstream(local_1840);
                          poVar5 = ::std::operator<<((ostream *)local_1840,"[error]");
                          poVar5 = ::std::operator<<(poVar5,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                          poVar5 = ::std::operator<<(poVar5,":");
                          poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
                          poVar5 = ::std::operator<<(poVar5,"():");
                          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xf5d);
                          ::std::operator<<(poVar5," ");
                          ::std::allocator<char>::allocator();
                          ::std::__cxx11::string::string
                                    (local_1880,"Parsing attribute `{}` failed. Error: {}",
                                     &local_1881);
                          fmt::format<char[13],std::__cxx11::string>
                                    (&local_1860,(fmt *)local_1880,(string *)"invisibleIds",
                                     (char (*) [13])&ret_8,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)pPVar6);
                          poVar5 = ::std::operator<<((ostream *)local_1840,(string *)&local_1860);
                          ::std::operator<<(poVar5,"\n");
                          ::std::__cxx11::string::~string((string *)&local_1860);
                          ::std::__cxx11::string::~string(local_1880);
                          ::std::allocator<char>::~allocator((allocator<char> *)&local_1881);
                          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                            ::std::__cxx11::ostringstream::str();
                            ::std::operator+(local_18a8,local_18c8);
                            ::std::__cxx11::string::operator=
                                      ((string *)
                                       table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                       (string *)local_18a8);
                            ::std::__cxx11::string::~string((string *)local_18a8);
                            ::std::__cxx11::string::~string((string *)local_18c8);
                          }
                          spec_local._7_1_ = 0;
                          __range2._4_4_ = 1;
                          ::std::__cxx11::ostringstream::~ostringstream(local_1840);
                        }
                        anon_unknown_0::ParseResult::~ParseResult
                                  ((ParseResult *)(local_16a0 + 0x20));
                        if (__range2._4_4_ == 0) {
                          sVar4 = ::std::
                                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)local_70,(key_type *)local_98);
                          if (sVar4 == 0) {
                            pPVar6 = &local_98->second;
                            this = ::std::
                                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                   ::operator[](&(instancer->super_GPrim).props,(key_type *)local_98
                                               );
                            Property::operator=(this,pPVar6);
                            ::std::
                            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_70,&local_98->first);
                          }
                          sVar4 = ::std::
                                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)local_70,(key_type *)local_98);
                          if (sVar4 != 0) goto LAB_002c3d1d;
                          ::std::__cxx11::ostringstream::ostringstream(local_1a50);
                          poVar5 = ::std::operator<<((ostream *)local_1a50,"[error]");
                          poVar5 = ::std::operator<<(poVar5,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                          poVar5 = ::std::operator<<(poVar5,":");
                          poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
                          poVar5 = ::std::operator<<(poVar5,"():");
                          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xf60);
                          ::std::operator<<(poVar5," ");
                          ::std::operator+(&local_1a70,"Unsupported/unimplemented property: ",
                                           &local_98->first);
                          poVar5 = ::std::operator<<((ostream *)local_1a50,(string *)&local_1a70);
                          ::std::operator<<(poVar5,"\n");
                          ::std::__cxx11::string::~string((string *)&local_1a70);
                          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                            ::std::__cxx11::ostringstream::str();
                            ::std::operator+(local_1a90,local_1ab0);
                            ::std::__cxx11::string::operator=
                                      ((string *)
                                       table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                       (string *)local_1a90);
                            ::std::__cxx11::string::~string((string *)local_1a90);
                            ::std::__cxx11::string::~string((string *)local_1ab0);
                          }
                          spec_local._7_1_ = 0;
                          ::std::__cxx11::ostringstream::~ostringstream(local_1a50);
                          goto LAB_002c3d36;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if (__range2._4_4_ != 3) goto LAB_002c3d36;
      }
LAB_002c3d1d:
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
      ::operator++(&__end2);
    }
    spec_local._7_1_ = 1;
  }
  else {
    spec_local._7_1_ = 0;
  }
LAB_002c3d36:
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_70);
  return (bool)(spec_local._7_1_ & 1);
}

Assistant:

bool ReconstructPrim<PointInstancer>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    PointInstancer *instancer,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)warn;
  (void)references;
  (void)options;

  DCOUT("Reconstruct PointInstancer.");

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, instancer, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TARGET_PATHS_RELATION(table, prop, "prototypes", instancer->prototypes)
    PARSE_TYPED_ATTRIBUTE(table, prop, "protoIndices", PointInstancer, instancer->protoIndices)
    PARSE_TYPED_ATTRIBUTE(table, prop, "ids", PointInstancer, instancer->ids)
    PARSE_TYPED_ATTRIBUTE(table, prop, "positions", PointInstancer, instancer->positions)
    PARSE_TYPED_ATTRIBUTE(table, prop, "orientations", PointInstancer, instancer->orientations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "scales", PointInstancer, instancer->scales)
    PARSE_TYPED_ATTRIBUTE(table, prop, "velocities", PointInstancer, instancer->velocities)
    PARSE_TYPED_ATTRIBUTE(table, prop, "accelerations", PointInstancer, instancer->accelerations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "angularVelocities", PointInstancer, instancer->angularVelocities)
    PARSE_TYPED_ATTRIBUTE(table, prop, "invisibleIds", PointInstancer, instancer->invisibleIds)

    ADD_PROPERTY(table, prop, PointInstancer, instancer->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}